

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O2

size_type __thiscall serialization::json_iarchive::load_sequence_start(json_iarchive *this)

{
  SizeType SVar1;
  _Elt_pointer ppGVar2;
  undefined8 local_10;
  
  ppGVar2 = (this->stack_).c.
            super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppGVar2 !=
      (this->stack_).c.
      super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppGVar2 ==
        (this->stack_).c.
        super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppGVar2 = (this->stack_).c.
                super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if ((ppGVar2[-1]->data_).f.flags == 4) goto LAB_00119572;
  }
  throw_serialization_error("expect array","json");
LAB_00119572:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&stack0xfffffffffffffff0);
  SVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_10);
  return SVar1;
}

Assistant:

size_type load_sequence_start() const
    {
        if(stack_.empty() || (!stack_.top()->IsArray()))
            throw_serialization_error("expect array", "json");
        return stack_.top()->GetArray().Size();
    }